

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssUnsupportedMaskGen_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssUnsupportedMaskGen_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  char *in_R9;
  Input algorithm_identifier;
  AssertHelper AStack_88;
  Message local_80;
  string local_78;
  AssertionResult gtest_ar_;
  uint8_t kData [45];
  
  kData[0x20] = '\x06';
  kData[0x21] = '\t';
  kData[0x22] = '`';
  kData[0x23] = 0x86;
  kData[0x24] = 'H';
  kData[0x25] = '\x01';
  kData[0x26] = 'e';
  kData[0x27] = '\x03';
  kData[0x28] = '\x04';
  kData[0x29] = '\x02';
  kData[0x2a] = '\x03';
  kData[0x2b] = '\x05';
  kData[0x2c] = '\0';
  kData[0x10] = '\x1c';
  kData[0x11] = '0';
  kData[0x12] = '\x1a';
  kData[0x13] = '\x06';
  kData[0x14] = '\t';
  kData[0x15] = '*';
  kData[0x16] = 0x86;
  kData[0x17] = 'H';
  kData[0x18] = 0x86;
  kData[0x19] = 0xf7;
  kData[0x1a] = 'R';
  kData[0x1b] = '\x01';
  kData[0x1c] = '\x02';
  kData[0x1d] = '\b';
  kData[0x1e] = '0';
  kData[0x1f] = '\r';
  kData[0] = '0';
  kData[1] = '+';
  kData[2] = '\x06';
  kData[3] = '\t';
  kData[4] = '*';
  kData[5] = 0x86;
  kData[6] = 'H';
  kData[7] = 0x86;
  kData[8] = 0xf7;
  kData[9] = '\r';
  kData[10] = '\x01';
  kData[0xb] = '\x01';
  kData[0xc] = '\n';
  kData[0xd] = '0';
  kData[0xe] = '\x1e';
  kData[0xf] = 0xa1;
  algorithm_identifier.data_.size_ = 0x2d;
  algorithm_identifier.data_.data_ = kData;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       ((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
               super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&gtest_ar_,
               (AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x2ff,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    ::std::__cxx11::string::~string((string *)&local_78);
    if (local_80.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_80.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssUnsupportedMaskGen) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x2B,  // SEQUENCE (43 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x1E,  // SEQUENCE (30 bytes)
      0xA1, 0x1C,  // [1] (28 bytes)
      0x30, 0x1A,  // SEQUENCE (26 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x52, 0x01, 0x02, 0x08,
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}